

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

VM * newVM(void)

{
  VM *vm;
  ObjMap *pOVar1;
  Parser **ppPVar2;
  
  vm = (VM *)malloc(0x90);
  if (vm == (VM *)0x0) {
    errorReport((void *)0x0,ERROR_MEM,"allocate VM failed!");
    _DAT_00000058 = 0;
    _DAT_00000060 = 0;
    _DAT_00000088 = 0;
    StringBufferInit((StringBuffer *)0x68);
    _DAT_00000078 = newObjMap((VM *)0x0);
    ppPVar2 = (Parser **)&DAT_00000088;
  }
  else {
    vm->allocatedBytes = 0;
    vm->allObjects = (ObjHeader *)0x0;
    ppPVar2 = &vm->curParser;
    vm->curParser = (Parser *)0x0;
    StringBufferInit(&vm->allMethodNames);
    pOVar1 = newObjMap(vm);
    vm->allModules = pOVar1;
  }
  *ppPVar2 = (Parser *)0x0;
  buildCore(vm);
  return vm;
}

Assistant:

VM *newVM() {
    VM *vm = (VM *) malloc(sizeof(VM));
    if (vm == NULL) {
        MEM_ERROR("allocate VM failed!");
    }
    initVM(vm);
    buildCore(vm);
    return vm;
}